

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_sinc_resampler.cc
# Opt level: O1

void __thiscall
webrtc::PushSincResampler::Run(PushSincResampler *this,size_t frames,float *destination)

{
  size_t *v1;
  int16_t *piVar1;
  string *result;
  size_t sVar2;
  size_t local_198;
  FatalMessage local_190;
  
  v1 = &this->source_available_;
  local_198 = frames;
  if (this->source_available_ == frames) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (v1,&local_198,"source_available_ == frames");
  }
  if (result == (string *)0x0) {
    if (this->first_pass_ == true) {
      memset(destination,0,local_198 << 2);
      this->first_pass_ = false;
    }
    else {
      if (this->source_ptr_ == (float *)0x0) {
        if (local_198 != 0) {
          piVar1 = this->source_ptr_int_;
          sVar2 = 0;
          do {
            destination[sVar2] = (float)(int)piVar1[sVar2];
            sVar2 = sVar2 + 1;
          } while (local_198 != sVar2);
        }
      }
      else {
        memcpy(destination,this->source_ptr_,local_198 << 2);
      }
      *v1 = *v1 - local_198;
    }
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/push_sinc_resampler.cc"
             ,0x54,result);
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

void PushSincResampler::Run(size_t frames, float* destination) {
  // Ensure we are only asked for the available samples. This would fail if
  // Run() was triggered more than once per Resample() call.
  RTC_CHECK_EQ(source_available_, frames);

  if (first_pass_) {
    // Provide dummy input on the first pass, the output of which will be
    // discarded, as described in Resample().
    std::memset(destination, 0, frames * sizeof(*destination));
    first_pass_ = false;
    return;
  }

  if (source_ptr_) {
    std::memcpy(destination, source_ptr_, frames * sizeof(*destination));
  } else {
    for (size_t i = 0; i < frames; ++i)
      destination[i] = static_cast<float>(source_ptr_int_[i]);
  }
  source_available_ -= frames;
}